

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

ArgSlot __thiscall
Inline::MapActuals(Inline *this,Instr *callInstr,Instr **argOuts,ArgSlot formalCount,Func *inlinee,
                  ProfileId callSiteId,bool *stackArgsArgOutExpanded,Instr **argOutsExtra,
                  ArgSlot maxParamCount)

{
  StackSym *this_00;
  Instr *pIVar1;
  code *pcVar2;
  Inline *pIVar3;
  bool bVar4;
  OpndKind OVar5;
  ArgSlot AVar6;
  OpCode OVar7;
  uint uVar8;
  int iVar9;
  int32 iVar10;
  uint uVar11;
  undefined4 *puVar12;
  JITTimeFunctionBody *this_01;
  StackSym *sym;
  SymOpnd *dstOpnd;
  undefined4 extraout_var;
  AddrOpnd *this_02;
  Instr *pIVar13;
  IntConstOpnd *pIVar14;
  uint uVar15;
  undefined6 in_register_0000000a;
  Func *pFVar16;
  ulong uVar17;
  ushort uVar18;
  Opnd *this_03;
  Func *pFVar19;
  int iVar20;
  uint uVar21;
  int local_84;
  ulong local_80;
  Inline *local_78;
  Func *local_70;
  Instr **local_68;
  Instr *local_60;
  int local_58;
  uint local_54;
  undefined4 *local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  ProfileId local_32 [4];
  ProfileId callSiteId_local;
  
  uVar17 = CONCAT62(in_register_0000000a,formalCount) & 0xffffffff;
  uVar8 = (uint)CONCAT62(in_register_0000000a,formalCount);
  local_70 = inlinee;
  local_68 = argOuts;
  local_60 = callInstr;
  local_32[0] = callSiteId;
  if (maxParamCount < (ushort)uVar17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x130d,"(formalCount <= maxParamCount)","formalCount <= maxParamCount");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  pFVar19 = local_70;
  this_03 = local_60->m_src2;
  *stackArgsArgOutExpanded = false;
  local_48 = this->currentInlineeFrameSlot;
  if (local_70 != (Func *)0x0) {
    bVar4 = GetInlineeHasArgumentObject(this,local_70);
    if ((*(uint *)&pFVar19->field_0x240 >> 10 & 1) == 0) {
      *(uint *)&pFVar19->field_0x240 = *(uint *)&pFVar19->field_0x240 | (uint)bVar4 << 10;
    }
    pFVar16 = pFVar19->parentFunc;
    if (bVar4 && pFVar16 != (Func *)0x0) {
      do {
        pFVar16->field_0x241 = pFVar16->field_0x241 | 4;
        pFVar16 = pFVar16->parentFunc;
      } while (pFVar16 != (Func *)0x0);
    }
  }
  OVar5 = IR::Opnd::GetKind(this_03);
  if (OVar5 == OpndKindSym) {
    local_40 = 0;
    local_48 = local_48 + 2;
    local_78 = this;
    local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_80 = (ulong)callSiteId;
    local_58 = formalCount - 1;
    uVar21 = 0;
    local_54 = uVar8;
    do {
      OVar5 = IR::Opnd::GetKind(this_03);
      puVar12 = local_50;
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1321,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar4) goto LAB_00549129;
        *puVar12 = 0;
      }
      OVar5 = IR::Opnd::GetKind(this_03);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_00549129;
        *puVar12 = 0;
      }
      this_00 = (StackSym *)this_03[1]._vptr_Opnd;
      if ((this_00->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_00549129;
        *puVar12 = 0;
      }
      uVar8 = *(uint *)&this_00->field_0x18;
      if ((uVar8 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1324,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar4) goto LAB_00549129;
        *puVar12 = 0;
        uVar8 = *(uint *)&this_00->field_0x18;
      }
      uVar15 = uVar8 & 0x100000;
      if ((uVar15 != 0) && (*(short *)&(this_00->super_Sym).field_0x16 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_00549129;
        *puVar12 = 0;
        uVar8 = *(uint *)&this_00->field_0x18;
        uVar15 = uVar8 & 0x100000;
      }
      if (uVar15 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1325,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar4) goto LAB_00549129;
        *puVar12 = 0;
        uVar8 = *(uint *)&this_00->field_0x18;
      }
      *(uint *)&this_00->field_0x18 = uVar8 | 0x4000;
      pFVar16 = local_78->topFunc;
      AVar6 = StackSym::GetArgSlotNum(this_00);
      Func::SetArgOffset(pFVar16,this_00,(AVar6 + local_48) * 8);
      pIVar1 = (this_00->field_5).m_instrDef;
      OVar7 = pIVar1->m_opcode;
      if ((pFVar19 == (Func *)0x0) || (OVar7 != ArgOut_A)) {
        if (pFVar19 != (Func *)0x0) goto LAB_0054891e;
      }
      else {
        if ((pFVar19->field_0x241 & 4) == 0) {
          pIVar1->m_opcode = ArgOut_A_Inline;
        }
        this_01 = JITTimeWorkItem::GetJITFunctionBody(pFVar19->m_workItem);
        bVar4 = JITTimeFunctionBody::IsAsmJsMode(this_01);
        if (!bVar4) {
          IR::Instr::GenerateBytecodeArgOutCapture(pIVar1);
        }
        OVar7 = pIVar1->m_opcode;
LAB_0054891e:
        if (OVar7 == ArgOut_A_FromStackArgs) {
          iVar20 = local_58;
          local_44 = uVar21;
          if (1 < (ushort)uVar17) {
            do {
              AVar6 = StackSym::GetArgSlotNum(this_00);
              sym = StackSym::NewArgSlotSym(AVar6,pIVar1->m_func,TyVar);
              sym->field_0x19 = sym->field_0x19 | 0x40;
              dstOpnd = IR::SymOpnd::New(&sym->super_Sym,this_00->m_type,pIVar1->m_func);
              pIVar3 = local_78;
              iVar9 = (*local_78->topFunc->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
              this_02 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar9),AddrOpndKindDynamicVar,
                                          pIVar3->topFunc,true,(Var)0x0);
              IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)0x2);
              pIVar13 = IR::Instr::New(ArgOut_A_FixupForStackArgs,&dstOpnd->super_Opnd,
                                       &this_02->super_Opnd,pIVar1->m_src2,pIVar1->m_func);
              IR::Instr::InsertBefore(pIVar1,pIVar13);
              IR::Instr::ReplaceSrc2(pIVar1,pIVar13->m_dst);
              StackSym::IncrementArgSlotNum(this_00);
              pFVar19 = pIVar1->m_func;
              AVar6 = StackSym::GetArgSlotNum(this_00);
              Func::SetArgOffset(pFVar19,this_00,(AVar6 + local_48) * 8);
              IR::Instr::GenerateArgOutSnapshot(pIVar13);
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
            local_40 = (ulong)(uint)((int)local_40 + local_58);
          }
          pIVar14 = IR::IntConstOpnd::New(local_80,TyUint16,pIVar1->m_func,false);
          IR::Instr::ReplaceSrc1(pIVar1,&pIVar14->super_Opnd);
          uVar21 = local_44 - 1;
          *stackArgsArgOutExpanded = true;
          uVar17 = (ulong)local_54;
        }
      }
      AVar6 = StackSym::GetArgSlotNum(this_00);
      uVar18 = AVar6 - 1;
      if (uVar18 < (ushort)uVar17) {
        pIVar13 = pIVar1;
        if (0xe < uVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = local_50;
          *local_50 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x1368,"(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                             "currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar4) goto LAB_00549129;
          *puVar12 = 0;
        }
LAB_00548ac1:
        local_68[uVar18] = pIVar13;
      }
      else if (pIVar1->m_opcode != ArgOut_A_FromStackArgs) {
        if (0xf < uVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = local_50;
          *local_50 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x136f,"(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount)"
                             ,"currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar4) goto LAB_00549129;
          *puVar12 = 0;
        }
        if ((argOutsExtra != (Instr **)0x0) &&
           (argOutsExtra[uVar18] = pIVar1, uVar18 < maxParamCount)) {
          pIVar13 = (Instr *)0x0;
          goto LAB_00548ac1;
        }
      }
      uVar21 = uVar21 + 1;
      this_03 = pIVar1->m_src2;
      OVar5 = IR::Opnd::GetKind(this_03);
      pFVar19 = local_70;
    } while (OVar5 == OpndKindSym);
    if (0xf < (ushort)uVar21) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = local_50;
      *local_50 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x137e,"(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                         "actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
      if (!bVar4) goto LAB_00549129;
      *puVar12 = 0;
    }
    puVar12 = local_50;
    uVar8 = (uint)uVar17;
    if ((ushort)uVar21 < (ushort)uVar17) {
      uVar8 = uVar21;
    }
    local_44 = uVar21;
    if ((short)uVar8 != 0) {
      uVar17 = 0;
      do {
        if (local_68[uVar17] == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x1382,"(argOuts[i])","argOuts[i]");
          if (!bVar4) goto LAB_00549129;
          *puVar12 = 0;
        }
        uVar17 = uVar17 + 1;
      } while ((uVar8 & 0xffff) != uVar17);
    }
    local_40 = (ulong)((int)local_40 - 1);
    uVar21 = local_44;
    uVar8 = local_54;
  }
  else {
    local_40 = 0xffffffff;
    uVar21 = 0;
  }
  AVar6 = (ArgSlot)uVar21;
  OVar5 = IR::Opnd::GetKind(this_03);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,4999,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  OVar5 = IR::Opnd::GetKind(this_03);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  if (((ulong)this_03[1]._vptr_Opnd[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,5000,"(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  OVar5 = IR::Opnd::GetKind(this_03);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  if (*(short *)(this_03[1]._vptr_Opnd[5] + 0x30) != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x138a,"(startCallOpCode == Js::OpCode::StartCall)",
                       "startCallOpCode == Js::OpCode::StartCall");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  if (*stackArgsArgOutExpanded == true) {
    OVar5 = IR::Opnd::GetKind(this_03);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00549129;
      *puVar12 = 0;
    }
    pIVar14 = *(IntConstOpnd **)(this_03[1]._vptr_Opnd[5] + 0x48);
    OVar5 = IR::Opnd::GetKind(&pIVar14->super_Opnd);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_00549129;
      *puVar12 = 0;
    }
    iVar10 = IR::IntConstOpnd::AsInt32(pIVar14);
    IR::IntConstOpnd::SetValue(pIVar14,(long)(iVar10 + (int)local_40));
    pIVar1 = local_60;
    Func::EnsureCallSiteToArgumentsOffsetFixupMap(local_60->m_func);
    bVar4 = JsUtil::
            BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(pIVar1->m_func->callSiteToArgumentsOffsetFixupMap,local_32);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x139a,
                         "(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)))"
                         ,
                         "!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId))"
                        );
      if (!bVar4) goto LAB_00549129;
      *puVar12 = 0;
    }
    local_84 = (int)local_40;
    JsUtil::
    BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)local_60->m_func->callSiteToArgumentsOffsetFixupMap,local_32,&local_84);
  }
  OVar5 = IR::Opnd::GetKind(this_03);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  uVar11 = IR::Instr::GetArgOutCount((Instr *)this_03[1]._vptr_Opnd[5],false);
  if (uVar11 != (uVar21 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x139e,
                       "(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount)"
                       ,
                       "linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount"
                      );
    if (!bVar4) goto LAB_00549129;
    *puVar12 = 0;
  }
  OVar5 = IR::Opnd::GetKind(this_03);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) {
LAB_00549129:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar12 = 0;
  }
  *(uint *)(this_03[1]._vptr_Opnd + 3) = *(uint *)(this_03[1]._vptr_Opnd + 3) | 0x4000;
  if (AVar6 < (ushort)uVar8) {
    memset(local_68 + (uVar21 & 0xffff),0,(ulong)(uVar8 + ~uVar21 & 0xffff) * 8 + 8);
  }
  if (*stackArgsArgOutExpanded == true) {
    AVar6 = local_60->m_func->actualCount;
  }
  return AVar6;
}

Assistant:

Js::ArgSlot
Inline::MapActuals(IR::Instr *callInstr, __out_ecount(maxParamCount) IR::Instr *argOuts[],
    Js::ArgSlot formalCount,
    Func* inlinee,
    Js::ProfileId callSiteId,
    bool *stackArgsArgOutExpanded,
    IR::Instr *argOutsExtra[],
    Js::ArgSlot maxParamCount /* = Js::InlineeCallInfo::MaxInlineeArgoutCount*/)
{
    AnalysisAssert(formalCount <= maxParamCount);

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = 0;

    *stackArgsArgOutExpanded = false;
    uint inlineeFrameSlot = currentInlineeFrameSlot + (Js::Constants::InlineeMetaArgCount - 1);
    uint fixupArgoutCount = 0;

    if (inlinee)
    {
        bool hasArgumentsAccess = this->GetInlineeHasArgumentObject(inlinee);
        inlinee->SetHasUnoptimizedArgumentsAccess(hasArgumentsAccess);
    }

    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();

            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            sym->m_isInlinedArgSlot = true;
            this->topFunc->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);
            argInstr = sym->m_instrDef;
            if (argInstr->m_opcode == Js::OpCode::ArgOut_A)
            {
                if(inlinee)
                {
                    if (!inlinee->GetHasUnoptimizedArgumentsAccess())
                    {
                        // This allows us to markTemp the argOut source.
                        argInstr->m_opcode = Js::OpCode::ArgOut_A_Inline;
                    }
                    if (!inlinee->GetJITFunctionBody()->IsAsmJsMode())
                    {
                        argInstr->GenerateBytecodeArgOutCapture();
                    }
                }
            }

            // Expand
            //
            // s31 ArgOut_A s32
            // s30 ArgOut_A_FromStackArgs s31
            //
            // to
            //
            // s31 ArgOut_A(_Inline) s32
            // sXX ArgOut_A_FixupForStackArgs s31
            // .
            // .
            // s34 ArgOut_A_FixupForStackArgs sXX
            // s30 ArgOut_A_FromStackArgs s34

            if (inlinee && argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)
            {
                IR::Instr * argFixupInstr;
                for(uint currentFormal = 1; currentFormal < formalCount; currentFormal++)
                {
                    StackSym* newStackSym = StackSym::NewArgSlotSym(sym->GetArgSlotNum(), argInstr->m_func);
                    newStackSym->m_isInlinedArgSlot = true;

                    IR::SymOpnd * newLinkOpnd = IR::SymOpnd::New(newStackSym, sym->GetType(), argInstr->m_func);
                    IR::Opnd * undefined = IR::AddrOpnd::New(this->topFunc->GetScriptContextInfo()->GetUndefinedAddr(),
                                                IR::AddrOpndKindDynamicVar, this->topFunc, true);
                    undefined->SetValueType(ValueType::Undefined);

                    argFixupInstr = IR::Instr::New(Js::OpCode::ArgOut_A_FixupForStackArgs, newLinkOpnd, undefined, argInstr->GetSrc2(), argInstr->m_func);
                    argInstr->InsertBefore(argFixupInstr);
                    argInstr->ReplaceSrc2(argFixupInstr->GetDst());
                    sym->IncrementArgSlotNum();
                    argInstr->m_func->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);

                    argFixupInstr->GenerateArgOutSnapshot();
                    fixupArgoutCount++;
                }
                // Now that the arguments object has been expanded, we don't require the sym corresponding to it.
                IR::IntConstOpnd* callSiteIdOpnd = IR::IntConstOpnd::New(callSiteId, TyUint16, argInstr->m_func);
                argInstr->ReplaceSrc1(callSiteIdOpnd);
                // Don't count ArgOut_A_FromStackArgs as an actual, when it has been expanded
                --actualCount;
                *stackArgsArgOutExpanded = true;
            }
            ++actualCount;
            const Js::ArgSlot currentActual = sym->GetArgSlotNum() - 1;
            if (currentActual < formalCount)
            {
                Assert(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                argOuts[currentActual] = argInstr;
            }

            // We don't want to treat ArgOut_A_FromStackArgs as an actual arg.
            else if (argInstr->m_opcode != Js::OpCode::ArgOut_A_FromStackArgs)
            {
                Assert(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
                if(argOutsExtra)
                {
                    argOutsExtra[currentActual] = argInstr;
                    if (currentActual < maxParamCount)
                    {
                        __analysis_assume(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                        argOuts[currentActual] = nullptr;
                    }
                }
            }
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
#if DBG
        Assert(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
        for(Js::ArgSlot i = 0; i < min(actualCount, formalCount); ++i)
        {
#pragma prefast(suppress:6001)
            Assert(argOuts[i]);
        }
#endif
    }

    Assert(linkOpnd->IsRegOpnd());
    Assert(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef);
    Js::OpCode startCallOpCode = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->m_opcode;
    Assert(startCallOpCode == Js::OpCode::StartCall);

    // Update the count in StartCall to reflect
    //  1. ArgOut_A_FromStackArgs is not an actual once it has been expanded.
    //  2. The expanded argouts (from ArgOut_A_FromStackArgs).
    //
    // Note that the StartCall will reflect the formal count only as of now; the actual count would be set during MapFormals
    if(*stackArgsArgOutExpanded)
    {
        // TODO: Is an underflow here intended, it triggers on test\inlining\OS_2733280.js
        IR::IntConstOpnd * countOpnd = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd();
        int32 count = countOpnd->AsInt32();
        count += fixupArgoutCount - 1;
        countOpnd->SetValue(count);

        callInstr->m_func->EnsureCallSiteToArgumentsOffsetFixupMap();
        Assert(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)));
        callInstr->m_func->callSiteToArgumentsOffsetFixupMap->Add(callSiteId, fixupArgoutCount - 1);
    }

    Assert(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

    // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
    // and not adjust the stack height on x86
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

    // Missing arguments...
    for (Js::ArgSlot i = actualCount; i < formalCount; i++)
    {
        argOuts[i] = nullptr;
    }

    // We may not know the exact number of actuals that "b" gets in a.b.apply just yet, since we have expanded the ArgOut_A_FromStackArgs based on the number of formals "b" accepts.
    // So, return the actualCount stored on the func if the ArgOut_A_FromStackArgs was expanded (and thus, the expanded argouts were accounted for in calculating the local actualCount)
    return *stackArgsArgOutExpanded ? callInstr->m_func->actualCount : actualCount;
}